

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O3

void __thiscall chrono::ChMarker::ArchiveIN(ChMarker *this,ChArchiveIn *marchive)

{
  eChMarkerMotion_mapper mmapper;
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  ChEnumMapper<chrono::ChMarker::eChMarkerMotion> local_78;
  eChMarkerMotion_mapper local_58;
  shared_ptr<chrono::ChFunction> local_38;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChMarker>(marchive);
  ChObj::ArchiveIN(&this->super_ChObj,marchive);
  ChFrameMoving<double>::ArchiveIN(&this->super_ChFrameMoving<double>,marchive);
  eChMarkerMotion_mapper::eChMarkerMotion_mapper(&local_58);
  eChMarkerMotion_mapper::operator()(&local_78,&local_58,&this->motion_type);
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x954779;
  local_28 = 0;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_78;
  (**(code **)(*(long *)marchive + 0x58))(marchive,&local_38);
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b03660
  ;
  if (local_78.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_X;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x954785;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_Y;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x95478e;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_Z;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x954797;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_78.value_ptr = (eChMarkerMotion *)&this->motion_ang;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9547a0;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  ChArchiveIn::in<chrono::ChFunction>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChFunction>_> *)&local_78);
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->motion_axis;
  local_78.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)0x9547ab;
  local_78.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  local_38.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__ChFunctorArchiveIn_00b03258;
  local_78.value_ptr = (eChMarkerMotion *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  local_58.super_ChEnumMapper<chrono::ChMarker::eChMarkerMotion>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b03660;
  if (local_58.super_ChEnumMapper<chrono::ChMarker::eChMarkerMotion>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super_ChEnumMapper<chrono::ChMarker::eChMarkerMotion>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>,_std::allocator<chrono::ChEnumNamePair<chrono::ChMarker::eChMarkerMotion>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChMarker::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChMarker>();

    // deserialize parent class
    ChObj::ArchiveIN(marchive);
    // deserialize parent class
    ChFrameMoving<double>::ArchiveIN(marchive);

    // stream in all member data:
    eChMarkerMotion_mapper mmapper;
    marchive >> CHNVP(mmapper(motion_type), "motion_type");
    marchive >> CHNVP(motion_X);
    marchive >> CHNVP(motion_Y);
    marchive >> CHNVP(motion_Z);
    marchive >> CHNVP(motion_ang);
    marchive >> CHNVP(motion_axis);
}